

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O0

void __thiscall btMLCPSolver::createMLCP(btMLCPSolver *this,btContactSolverInfo *infoGlobal)

{
  float fVar1;
  float fVar2;
  btScalar bVar3;
  btRigidBody *this_00;
  btSolverConstraint *pbVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  btSolverConstraint **ppbVar8;
  float *pfVar9;
  btSolverBody *pbVar10;
  btMatrix3x3 *this_01;
  btVector3 *pbVar11;
  long in_RSI;
  long in_RDI;
  btSolverConstraint *c_1;
  int i_4;
  int i_3;
  CProfileSample __profile_1;
  CProfileSample __profile;
  int bodyIndex1;
  int bodyIndex0;
  int i_2;
  int c;
  int r;
  btRigidBody *orgBody;
  btVector3 *invMass;
  btSolverBody *rb;
  int i_1;
  int i;
  int numConstraintRows;
  int numBodies;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  btScalar in_stack_fffffffffffffda4;
  btMatrixX<float> *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int local_180;
  int local_17c;
  int local_54;
  int local_50;
  int local_4c;
  int local_30;
  int local_1c;
  
  iVar5 = btAlignedObjectArray<btSolverBody>::size
                    ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8));
  iVar6 = btAlignedObjectArray<btSolverConstraint_*>::size
                    ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0));
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd9c);
  if (*(int *)(in_RSI + 0x2c) != 0) {
    btVectorX<float>::resize
              ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd9c);
  }
  btVectorX<float>::setZero
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  btVectorX<float>::setZero
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  for (local_1c = 0; local_1c < iVar6; local_1c = local_1c + 1) {
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_1c);
    if (((*ppbVar8)->m_jacDiagABInv != 0.0) || (NAN((*ppbVar8)->m_jacDiagABInv))) {
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_1c);
      fVar1 = (*ppbVar8)->m_rhs;
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_1c);
      fVar2 = (*ppbVar8)->m_jacDiagABInv;
      pfVar9 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          in_stack_fffffffffffffd9c);
      *pfVar9 = fVar1 / fVar2;
      if (*(int *)(in_RSI + 0x2c) != 0) {
        ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                            ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_1c
                            );
        fVar1 = (*ppbVar8)->m_rhsPenetration;
        ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                            ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_1c
                            );
        fVar2 = (*ppbVar8)->m_jacDiagABInv;
        pfVar9 = btVectorX<float>::operator[]
                           ((btVectorX<float> *)
                            CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                            in_stack_fffffffffffffd9c);
        *pfVar9 = fVar1 / fVar2;
      }
    }
  }
  if ((createMLCP(btContactSolverInfo_const&)::Minv == '\0') &&
     (iVar7 = __cxa_guard_acquire(&createMLCP(btContactSolverInfo_const&)::Minv), iVar7 != 0)) {
    btMatrixX<float>::btMatrixX(in_stack_fffffffffffffdb0);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCP::Minv,&__dso_handle);
    __cxa_guard_release(&createMLCP(btContactSolverInfo_const&)::Minv);
  }
  btMatrixX<float>::resize
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
  btMatrixX<float>::setZero(in_stack_fffffffffffffdb0);
  for (local_30 = 0; local_30 < iVar5; local_30 = local_30 + 1) {
    pbVar10 = btAlignedObjectArray<btSolverBody>::operator[]
                        ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8),local_30);
    pbVar11 = &pbVar10->m_invMass;
    btVector3::operator_cast_to_float_(pbVar11);
    setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
            in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
    btVector3::operator_cast_to_float_(pbVar11);
    setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
            in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
    btVector3::operator_cast_to_float_(pbVar11);
    setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
            in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
    pbVar10 = btAlignedObjectArray<btSolverBody>::operator[]
                        ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8),local_30);
    this_00 = pbVar10->m_originalBody;
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
        if (this_00 != (btRigidBody *)0x0) {
          this_01 = btRigidBody::getInvInertiaTensorWorld(this_00);
          pbVar11 = btMatrix3x3::operator[](this_01,local_4c);
          btVector3::operator_cast_to_float_(pbVar11);
        }
        setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      }
    }
  }
  if ((createMLCP(btContactSolverInfo_const&)::J == '\0') &&
     (iVar5 = __cxa_guard_acquire(&createMLCP(btContactSolverInfo_const&)::J), iVar5 != 0)) {
    btMatrixX<float>::btMatrixX(in_stack_fffffffffffffdb0);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCP::J,&__dso_handle);
    __cxa_guard_release(&createMLCP(btContactSolverInfo_const&)::J);
  }
  btMatrixX<float>::resize
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
  btMatrixX<float>::setZero(in_stack_fffffffffffffdb0);
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd9c);
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd9c);
  for (local_54 = 0; local_54 < iVar6; local_54 = local_54 + 1) {
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
    bVar3 = (*ppbVar8)->m_lowerLimit;
    pfVar9 = btVectorX<float>::operator[]
                       ((btVectorX<float> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd9c);
    *pfVar9 = bVar3;
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
    bVar3 = (*ppbVar8)->m_upperLimit;
    pfVar9 = btVectorX<float>::operator[]
                       ((btVectorX<float> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd9c);
    *pfVar9 = bVar3;
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
    iVar5 = (*ppbVar8)->m_solverBodyIdA;
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
    iVar7 = (*ppbVar8)->m_solverBodyIdB;
    pbVar10 = btAlignedObjectArray<btSolverBody>::operator[]
                        ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8),iVar5);
    if (pbVar10->m_originalBody != (btRigidBody *)0x0) {
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_contactNormal1);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      in_stack_fffffffffffffe10 = iVar5 * 6 + 1;
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_contactNormal1);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      in_stack_fffffffffffffe18 = iVar5 * 6 + 2;
      in_stack_fffffffffffffe14 = local_54;
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_contactNormal1);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      in_stack_fffffffffffffe1c = local_54;
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_relpos1CrossNormal);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_relpos1CrossNormal);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_relpos1CrossNormal);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
    }
    pbVar10 = btAlignedObjectArray<btSolverBody>::operator[]
                        ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 8),iVar7);
    if (pbVar10->m_originalBody != (btRigidBody *)0x0) {
      in_stack_fffffffffffffdd8 = iVar7 * 6;
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_contactNormal2);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      in_stack_fffffffffffffddc = local_54;
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_contactNormal2);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_contactNormal2);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_relpos2CrossNormal);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_relpos2CrossNormal);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
      ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_54);
      btVector3::operator_cast_to_float_(&(*ppbVar8)->m_relpos2CrossNormal);
      setElem((btMatrixXf *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
    }
  }
  if ((createMLCP(btContactSolverInfo_const&)::J_transpose == '\0') &&
     (iVar5 = __cxa_guard_acquire(&createMLCP(btContactSolverInfo_const&)::J_transpose), iVar5 != 0)
     ) {
    btMatrixX<float>::btMatrixX(in_stack_fffffffffffffdb0);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCP::J_transpose,&__dso_handle);
    __cxa_guard_release(&createMLCP(btContactSolverInfo_const&)::J_transpose);
  }
  btMatrixX<float>::transpose
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  btMatrixX<float>::operator=
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  btMatrixX<float>::~btMatrixX
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  if ((createMLCP(btContactSolverInfo_const&)::tmp == '\0') &&
     (iVar5 = __cxa_guard_acquire(&createMLCP(btContactSolverInfo_const&)::tmp), iVar5 != 0)) {
    btMatrixX<float>::btMatrixX(in_stack_fffffffffffffdb0);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCP::tmp,&__dso_handle);
    __cxa_guard_release(&createMLCP(btContactSolverInfo_const&)::tmp);
  }
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  btMatrixX<float>::operator*
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  btMatrixX<float>::operator=
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  btMatrixX<float>::~btMatrixX
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  CProfileSample::~CProfileSample((CProfileSample *)0x2629d3);
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  btMatrixX<float>::operator*
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  btMatrixX<float>::operator=
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  btMatrixX<float>::~btMatrixX
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  CProfileSample::~CProfileSample((CProfileSample *)0x262a3c);
  local_17c = 0;
  while (iVar5 = local_17c, iVar6 = btMatrixX<float>::rows((btMatrixX<float> *)(in_RDI + 0x148)),
        iVar5 < iVar6) {
    btMatrixX<float>::operator()
              ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98);
    btMatrixX<float>::setElem
              ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,0.0);
    local_17c = local_17c + 1;
  }
  btVectorX<float>::resize
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd9c);
  if (*(int *)(in_RSI + 0x2c) != 0) {
    btVectorX<float>::resize
              ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd9c);
  }
  for (local_180 = 0;
      iVar5 = btAlignedObjectArray<btSolverConstraint_*>::size
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0)),
      local_180 < iVar5; local_180 = local_180 + 1) {
    ppbVar8 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x2c0),local_180);
    pbVar4 = *ppbVar8;
    bVar3 = pbVar4->m_appliedImpulse;
    pfVar9 = btVectorX<float>::operator[]
                       ((btVectorX<float> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd9c);
    *pfVar9 = bVar3;
    if (*(int *)(in_RSI + 0x2c) != 0) {
      in_stack_fffffffffffffda4 = pbVar4->m_appliedPushImpulse;
      pfVar9 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          in_stack_fffffffffffffd9c);
      *pfVar9 = in_stack_fffffffffffffda4;
    }
  }
  return;
}

Assistant:

void btMLCPSolver::createMLCP(const btContactSolverInfo& infoGlobal)
{
	int numBodies = this->m_tmpSolverBodyPool.size();
	int numConstraintRows = m_allConstraintPtrArray.size();

	m_b.resize(numConstraintRows);
	if (infoGlobal.m_splitImpulse)
		m_bSplit.resize(numConstraintRows);
 
	m_bSplit.setZero();
	m_b.setZero();

	for (int i=0;i<numConstraintRows ;i++)
	{
		if (m_allConstraintPtrArray[i]->m_jacDiagABInv)
		{
			m_b[i]=m_allConstraintPtrArray[i]->m_rhs/m_allConstraintPtrArray[i]->m_jacDiagABInv;
			if (infoGlobal.m_splitImpulse)
				m_bSplit[i] = m_allConstraintPtrArray[i]->m_rhsPenetration/m_allConstraintPtrArray[i]->m_jacDiagABInv;
		}
	}
 
	static btMatrixXu Minv;
	Minv.resize(6*numBodies,6*numBodies);
	Minv.setZero();
	for (int i=0;i<numBodies;i++)
	{
		const btSolverBody& rb = m_tmpSolverBodyPool[i];
		const btVector3& invMass = rb.m_invMass;
		setElem(Minv,i*6+0,i*6+0,invMass[0]);
		setElem(Minv,i*6+1,i*6+1,invMass[1]);
		setElem(Minv,i*6+2,i*6+2,invMass[2]);
		btRigidBody* orgBody = m_tmpSolverBodyPool[i].m_originalBody;
 
		for (int r=0;r<3;r++)
			for (int c=0;c<3;c++)
				setElem(Minv,i*6+3+r,i*6+3+c,orgBody? orgBody->getInvInertiaTensorWorld()[r][c] : 0);
	}
 
	static btMatrixXu J;
	J.resize(numConstraintRows,6*numBodies);
	J.setZero();
 
	m_lo.resize(numConstraintRows);
	m_hi.resize(numConstraintRows);
 
	for (int i=0;i<numConstraintRows;i++)
	{

		m_lo[i] = m_allConstraintPtrArray[i]->m_lowerLimit;
		m_hi[i] = m_allConstraintPtrArray[i]->m_upperLimit;
 
		int bodyIndex0 = m_allConstraintPtrArray[i]->m_solverBodyIdA;
		int bodyIndex1 = m_allConstraintPtrArray[i]->m_solverBodyIdB;
		if (m_tmpSolverBodyPool[bodyIndex0].m_originalBody)
		{
			setElem(J,i,6*bodyIndex0+0,m_allConstraintPtrArray[i]->m_contactNormal1[0]);
			setElem(J,i,6*bodyIndex0+1,m_allConstraintPtrArray[i]->m_contactNormal1[1]);
			setElem(J,i,6*bodyIndex0+2,m_allConstraintPtrArray[i]->m_contactNormal1[2]);
			setElem(J,i,6*bodyIndex0+3,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[0]);
			setElem(J,i,6*bodyIndex0+4,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[1]);
			setElem(J,i,6*bodyIndex0+5,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[2]);
		}
		if (m_tmpSolverBodyPool[bodyIndex1].m_originalBody)
		{
			setElem(J,i,6*bodyIndex1+0,m_allConstraintPtrArray[i]->m_contactNormal2[0]);
			setElem(J,i,6*bodyIndex1+1,m_allConstraintPtrArray[i]->m_contactNormal2[1]);
			setElem(J,i,6*bodyIndex1+2,m_allConstraintPtrArray[i]->m_contactNormal2[2]);
			setElem(J,i,6*bodyIndex1+3,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[0]);
			setElem(J,i,6*bodyIndex1+4,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[1]);
			setElem(J,i,6*bodyIndex1+5,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[2]);
		}
	}
 
	static btMatrixXu J_transpose;
	J_transpose= J.transpose();

	static btMatrixXu tmp;

	{
		{
			BT_PROFILE("J*Minv");
			tmp = J*Minv;

		}
		{
			BT_PROFILE("J*tmp");
			m_A = tmp*J_transpose;
		}
	}

	if (1)
	{
		// add cfm to the diagonal of m_A
		for ( int i=0; i<m_A.rows(); ++i) 
		{
			m_A.setElem(i,i,m_A(i,i)+ m_cfm / infoGlobal.m_timeStep);
		}
	}

	m_x.resize(numConstraintRows);
	if (infoGlobal.m_splitImpulse)
		m_xSplit.resize(numConstraintRows);
//	m_x.setZero();

	for (int i=0;i<m_allConstraintPtrArray.size();i++)
	{
		const btSolverConstraint& c = *m_allConstraintPtrArray[i];
		m_x[i]=c.m_appliedImpulse;
		if (infoGlobal.m_splitImpulse)
			m_xSplit[i] = c.m_appliedPushImpulse;
	}

}